

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this)

{
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  *this_00;
  long lVar1;
  void *pvVar2;
  long lVar3;
  iterator iVar4;
  iterator __position;
  bool bVar5;
  _List_node_base *p_Var6;
  IMessageTarget *target;
  EnqueuedMessage *m;
  __shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> local_50;
  LockT lock;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar3 / 1000000;
  lVar1 = (this->nextMessageTime).super___atomic_base<long>._M_i;
  if (-1 < lVar1 && lVar1 <= lVar3) {
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->queueMutex);
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i = -1;
    UNLOCK();
    __position._M_node =
         (this->queue).
         super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    this_00 = &this->dispatch;
    bVar5 = false;
    while ((!bVar5 && (__position._M_node != (_List_node_base *)&this->queue))) {
      m = (EnqueuedMessage *)__position._M_node[1]._M_next;
      lVar1 = (m->time).__r;
      bVar5 = lVar3 < lVar1;
      if (lVar1 <= lVar3) {
        target = (IMessageTarget *)
                 (*(code *)((_List_node_base *)
                           (m->message).
                           super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_M_next[1]._M_next)();
        if (target == (IMessageTarget *)0x0) {
LAB_001cf90e:
          std::__cxx11::
          list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
          ::push_back(this_00,&m);
        }
        else {
          iVar4 = std::
                  _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
                  ::find(&(this->targets)._M_t,&target);
          if ((_Rb_tree_header *)iVar4._M_node !=
              &(this->targets)._M_t._M_impl.super__Rb_tree_header) goto LAB_001cf90e;
        }
        __position = std::__cxx11::
                     list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                     ::erase(&this->queue,__position._M_node);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    p_Var6 = (_List_node_base *)this_00;
    while (p_Var6 = (((_List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)this_00) {
      std::__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> *)
                 p_Var6[1]._M_next);
      Dispatch(this,(IMessagePtr *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      pvVar2 = p_Var6[1]._M_next;
      if (pvVar2 != (void *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)pvVar2 + 8));
      }
      operator_delete(pvVar2,0x18);
    }
    std::__cxx11::
    list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
    ::clear(this_00);
    if ((this->queue).
        super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
        ._M_impl._M_node._M_size != 0) {
      LOCK();
      (this->nextMessageTime).super___atomic_base<long>._M_i =
           (__int_type)
           (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void MessageQueue::Dispatch() {
    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    int64_t nextTime = nextMessageTime.load();

    if (nextTime > now.count() || nextTime < 0) {
        return; /* short circuit before any iteration. */
    }

    using Iterator = std::list<EnqueuedMessage*>::iterator;

    {
        LockT lock(this->queueMutex);

        this->nextMessageTime.store(-1);

        Iterator it = this->queue.begin();

        bool done = false;
        while (!done && it != this->queue.end()) {
            /* messages are time-ordered. pop and dispatch one at a time
            until we get to a message that should be delivered in the future,
            or the queue has been exhausted. */

            EnqueuedMessage *m = (*it);

            if (now >= m->time) {
                /* it's possible the target (receiver) has been unregistered;
                if that's the case, just discard it. otherwise, add it to the
                output set to be dispatched outside of the critical section */
                auto const target = (*it)->message->Target();
                if (target == nullptr || this->targets.find(target) != this->targets.end()) {
                    this->dispatch.push_back(m);
                }
                it = this->queue.erase(it);
            }
            else {
                done = true;
            }
        }
    }

    /* dispatch outside of the critical section */

    Iterator it = this->dispatch.begin();
    while (it != this->dispatch.end()) {
        this->Dispatch((*it)->message);
        delete *it;
        it++;
    }

    this->dispatch.clear();

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }
}